

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filesystem.c++
# Opt level: O1

String * __thiscall
kj::PathPtr::toString(String *__return_storage_ptr__,PathPtr *this,bool absolute)

{
  size_t sVar1;
  long lVar2;
  String *pSVar3;
  void *pvVar4;
  size_t sVar5;
  undefined7 in_register_00000011;
  long lVar6;
  ulong uVar7;
  size_t size;
  void *__src;
  kj *this_00;
  long lVar8;
  ArrayPtr<const_kj::String> *__range1;
  char *ptr;
  Fault f;
  DebugComparison<char_*&,_char_*> _kjCondition;
  char *local_68;
  Fault local_60;
  DebugComparison<char_*&,_char_*> local_58;
  
  uVar7 = CONCAT71(in_register_00000011,absolute) & 0xffffffff;
  sVar1 = (this->parts).size_;
  if (sVar1 == 0) {
    if ((byte)uVar7 == 0) {
      this_00 = (kj *)0x5c0fe8;
    }
    else {
      this_00 = (kj *)0x5c4e2d;
    }
    str<char_const(&)[2]>
              (__return_storage_ptr__,this_00,(char (*) [2])CONCAT71(in_register_00000011,absolute))
    ;
  }
  else {
    size = sVar1 - (byte)((byte)uVar7 ^ 1);
    lVar6 = 0;
    do {
      lVar2 = *(long *)((long)&(((this->parts).ptr)->content).size_ + lVar6);
      lVar8 = 0;
      if (lVar2 != 0) {
        lVar8 = lVar2 + -1;
      }
      size = size + lVar8;
      lVar6 = lVar6 + 0x18;
    } while (sVar1 * 0x18 != lVar6);
    heapString(__return_storage_ptr__,size);
    local_68 = (char *)(__return_storage_ptr__->content).size_;
    if (local_68 != (char *)0x0) {
      local_68 = (__return_storage_ptr__->content).ptr;
    }
    sVar1 = (this->parts).size_;
    if (sVar1 != 0) {
      pSVar3 = (this->parts).ptr;
      lVar6 = 0;
      do {
        if ((uVar7 & 1) != 0) {
          *local_68 = '/';
          local_68 = local_68 + 1;
        }
        pvVar4 = *(void **)((long)&(pSVar3->content).size_ + lVar6);
        __src = pvVar4;
        if (pvVar4 != (void *)0x0) {
          __src = *(void **)((long)&(pSVar3->content).ptr + lVar6);
        }
        sVar5 = (long)pvVar4 - 1;
        if (pvVar4 == (void *)0x0) {
          sVar5 = 0;
        }
        memcpy(local_68,__src,sVar5);
        lVar2 = *(long *)((long)&(pSVar3->content).size_ + lVar6);
        sVar5 = lVar2 - 1;
        if (lVar2 == 0) {
          sVar5 = 0;
        }
        local_68 = local_68 + sVar5;
        lVar6 = lVar6 + 0x18;
        uVar7 = 1;
      } while (sVar1 * 0x18 != lVar6);
    }
    sVar1 = (__return_storage_ptr__->content).size_;
    local_58.right = (__return_storage_ptr__->content).ptr + (sVar1 - 1);
    if (sVar1 == 0) {
      local_58.right = (char *)0x0;
    }
    local_58.left = &local_68;
    local_58.op.content.ptr = " == ";
    local_58.result = local_68 == local_58.right;
    local_58.op.content.size_ = 5;
    if (!local_58.result) {
      kj::_::Debug::Fault::Fault<kj::Exception::Type,kj::_::DebugComparison<char*&,char*>&>
                (&local_60,
                 "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/kj/filesystem.c++"
                 ,0x9a,FAILED,"ptr == result.end()","_kjCondition,",&local_58);
      kj::_::Debug::Fault::fatal(&local_60);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

String PathPtr::toString(bool absolute) const {
  if (parts.size() == 0) {
    // Special-case empty path.
    return absolute ? kj::str("/") : kj::str(".");
  }

  size_t size = absolute + (parts.size() - 1);
  for (auto& p: parts) size += p.size();

  String result = kj::heapString(size);

  char* ptr = result.begin();
  bool leadingSlash = absolute;
  for (auto& p: parts) {
    if (leadingSlash) *ptr++ = '/';
    leadingSlash = true;
    memcpy(ptr, p.begin(), p.size());
    ptr += p.size();
  }
  KJ_ASSERT(ptr == result.end());

  return result;
}